

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::scatterv<TwoBSA<unsigned_long>>
               (TwoBSA<unsigned_long> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               TwoBSA<unsigned_long> *out,size_t recv_size,int root,comm *comm)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> send_counts;
  datatype dt_1;
  datatype sizedt;
  size_t send_size;
  vector<int,_std::allocator<int>_> displs;
  
  puVar2 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (comm->m_rank == root) {
    if ((long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 >> 3 != (long)comm->m_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&sizedt);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)sizedt._vptr_datatype & 0xffffffff,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
             ,0x13f,"scatterv",
             "root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      puVar2 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  send_size = 0;
  if (puVar2 != puVar1) {
    do {
      uVar3 = (int)send_size + (int)*puVar2;
      send_size = (size_t)uVar3;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    send_size = (size_t)(int)uVar3;
  }
  sizedt._vptr_datatype = (_func_int **)&PTR__datatype_00150920;
  sizedt.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  sizedt.builtin = true;
  MPI_Bcast(&send_size,1,&ompi_mpi_unsigned_long,root,comm->mpi_comm);
  if (send_size < 0x7fffffff) {
    dt_1.mpitype = datatype_contiguous<unsigned_long,_3UL>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00150920;
    dt_1.builtin = false;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&send_counts,(long)comm->m_size,(allocator_type *)&displs);
      puVar2 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
      if (0 < lVar4) {
        uVar5 = lVar4 + 1;
        lVar4 = 0;
        do {
          *(undefined4 *)
           ((long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4) =
               *(undefined4 *)((long)puVar2 + lVar4 * 2);
          uVar5 = uVar5 - 1;
          lVar4 = lVar4 + 4;
        } while (1 < uVar5);
      }
      impl::get_displacements<int>(&displs,&send_counts);
      MPI_Scatterv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,dt_1.mpitype,out,recv_size & 0xffffffff,
                   dt_1.mpitype,root,comm->mpi_comm);
      if (displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,out,recv_size & 0xffffffff,dt_1.mpitype,root,
                   comm->mpi_comm);
    }
    datatype::~datatype(&dt_1);
  }
  else {
    impl::scatterv_big<TwoBSA<unsigned_long>>(msgs,sizes,out,recv_size,root,comm);
  }
  datatype::~datatype(&sizedt);
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), 0);
    mxx::datatype sizedt = mxx::get_datatype<size_t>();
    MPI_Bcast(&send_size, 1, sizedt.type(), root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}